

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::JsonLocation::Invalid
          (JsonLocation *this,char *param_2,undefined8 param_3,undefined8 param_4)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  JsonLocation *pJVar4;
  uint uVar5;
  size_type sVar6;
  byte bVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  const_iterator __begin3;
  _Alloc_hider _Var11;
  string to_obfuscate;
  string status_message;
  string local_c8;
  long *local_a8;
  undefined8 local_a0;
  long local_98 [2];
  JsonLocation *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70 [32];
  char local_50 [8];
  code *local_48;
  undefined8 *local_40;
  code *local_38;
  
  local_a8 = local_98;
  local_80 = param_3;
  local_78 = param_4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"invalid JSON","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if (*(long *)(param_2 + 0x18) != 0) {
    local_70._0_8_ = 4;
    local_70._8_8_ = " in ";
    absl::lts_20240722::StrAppend((string *)&local_c8,(AlphaNum *)local_70);
    MessagePath::Describe(*(MessagePath **)(param_2 + 0x18),&local_c8);
    std::__cxx11::string::push_back((char)&local_c8);
  }
  local_70._0_8_ = *(long *)(param_2 + 8) + 1;
  local_70._16_8_ = *(long *)(param_2 + 0x10) + 1;
  local_70._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_70._24_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_50 = *(char (*) [8])param_2;
  local_48 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_40 = &local_80;
  local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  absl::lts_20240722::str_format_internal::AppendPack
            (&local_c8," near %zu:%zu (offset %zu): %s",0x1e,local_70,4);
  sVar3 = local_c8._M_string_length;
  _Var11._M_p = local_c8._M_dataplus._M_p;
  lVar2 = (anonymous_namespace)::
          HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
          ::kCounterSeed;
  LOCK();
  (anonymous_namespace)::
  HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
  ::kCounterSeed =
       (anonymous_namespace)::
       HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
       ::kCounterSeed + 1;
  UNLOCK();
  if (local_c8._M_string_length != 0) {
    sVar6 = 0;
    do {
      sVar6 = sVar6 + 1;
    } while (local_c8._M_string_length != sVar6);
  }
  std::__cxx11::string::reserve((ulong)&local_a8);
  local_88 = this;
  if (sVar3 != 0) {
    uVar8 = ((long)&(anonymous_namespace)::
                    HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
                    ::kAslrSeed + lVar2) * 0x5851f42d4c957f2d + 0x1a08ee1184ba6d32;
    pcVar9 = _Var11._M_p + sVar3;
    do {
      cVar1 = *_Var11._M_p;
      std::__cxx11::string::push_back((char)&local_a8);
      if ((cVar1 == ' ') &&
         (uVar8 = uVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f,
         uVar5 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b), bVar7 = (byte)(uVar8 >> 0x3b),
         (uVar5 >> bVar7 | uVar5 << 0x20 - bVar7) * -0x55555555 < 0x55555556)) {
        uVar8 = uVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        uVar5 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
        bVar7 = (byte)(uVar8 >> 0x3b);
        uVar10 = (ulong)(((uVar5 >> bVar7 | uVar5 << 0x20 - bVar7) & 1) + 1);
        do {
          std::__cxx11::string::push_back((char)&local_a8);
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      _Var11._M_p = _Var11._M_p + 1;
    } while (_Var11._M_p != pcVar9);
  }
  pJVar4 = local_88;
  absl::lts_20240722::InvalidArgumentError(local_88,local_a0,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return (Status)(uintptr_t)pJVar4;
}

Assistant:

absl::Status JsonLocation::Invalid(absl::string_view message,
                                   SourceLocation sl) const {
  // NOTE: we intentionally do not harden the "invalid JSON" part, so that
  // people have a hope of grepping for it in logs. That part is easy to
  // commit to, as stability goes.
  //
  // This copies the error twice. Because this is the "unhappy" path, this
  // function is cold and can afford the waste.
  std::string status_message = "invalid JSON";
  std::string to_obfuscate;
  if (path != nullptr) {
    absl::StrAppend(&to_obfuscate, " in ");
    path->Describe(to_obfuscate);
    to_obfuscate.push_back(',');
  }
  absl::StrAppendFormat(&to_obfuscate, " near %zu:%zu (offset %zu): %s",
                        line + 1, col + 1, offset, message);
  HardenAgainstHyrumsLaw(to_obfuscate, status_message);

  return absl::InvalidArgumentError(std::move(status_message));
}